

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::handleGestureEvent(QWidgetWindow *this,QNativeGestureEvent *e)

{
  Data *pDVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QApplication::activePopupWidget();
  if (this_00 == (QWidget *)0x0) {
    local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    local_28 = QPointF::toPoint(&local_38);
    pQVar2 = QApplication::widgetAt(&local_28);
    if (pQVar2 == (QWidget *)0x0) {
      pDVar1 = (this->m_widget).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar2 = (QWidget *)0x0;
      }
      else {
        pQVar2 = (QWidget *)(this->m_widget).wp.value;
      }
    }
  }
  else {
    pQVar2 = QWidget::focusWidget(this_00);
    if (pQVar2 == (QWidget *)0x0) {
      pQVar2 = this_00;
    }
  }
  QCoreApplication::forwardEvent(&pQVar2->super_QObject,(QEvent *)e,(QEvent *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleGestureEvent(QNativeGestureEvent *e)
{
    // copy-pasted code to find correct widget follows:
    QObject *receiver = nullptr;
    if (auto *popup = QApplication::activePopupWidget()) {
        QWidget *popupFocusWidget = popup->focusWidget();
        receiver = popupFocusWidget ? popupFocusWidget : popup;
    }
    if (!receiver)
        receiver = QApplication::widgetAt(e->globalPosition().toPoint());
    if (!receiver)
        receiver = m_widget; // last resort

    QApplication::forwardEvent(receiver, e);
}